

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O2

void qemu_cmdline(char *name,char *value)

{
  int iVar1;
  char *buf;
  
  iVar1 = strcmp(name,"android.ril");
  if (iVar1 == 0) {
    iVar1 = asprintf(&buf,"/dev/%s",value);
    if (iVar1 != -1) {
      log_write(6,"<6>init: nani- buf:: %s\n",buf);
    }
  }
  return;
}

Assistant:

void qemu_cmdline(const char* name, const char *value)
{
    char *buf;
    if (!strcmp(name, "android.ril")) {
        /* cmd line params currently assume /dev/ prefix */
        if (asprintf(&buf, CMDLINE_PREFIX"/%s", value) == -1) {
            return;
        }
        INFO("nani- buf:: %s\n", buf);
    }
}